

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O2

uint32_t address_space_lduw_internal_cached_slow_ppc64
                   (uc_struct_conflict11 *uc,MemoryRegionCache *cache,hwaddr addr,MemTxAttrs attrs,
                   MemTxResult *result,device_endian endian)

{
  ushort uVar1;
  MemTxResult MVar2;
  MemoryRegion *mr;
  ushort *puVar3;
  uint64_t val;
  hwaddr addr1;
  hwaddr l;
  uint local_40 [2];
  ram_addr_t local_38;
  hwaddr local_30;
  
  local_30 = 2;
  mr = address_space_translate_cached(cache,addr,&local_38,&local_30,false,attrs);
  if ((local_30 < 2) || (mr->ram == false)) {
    MVar2 = memory_region_dispatch_read_ppc64
                      (uc,mr,local_38,(uint64_t *)local_40,
                       (uint)(endian != DEVICE_LITTLE_ENDIAN) * 8 + MO_16,attrs);
  }
  else {
    puVar3 = (ushort *)qemu_map_ram_ptr_ppc64((uc_struct_conflict11 *)mr->uc,mr->ram_block,local_38)
    ;
    uVar1 = *puVar3;
    if ((endian == DEVICE_BIG_ENDIAN) || (endian != DEVICE_LITTLE_ENDIAN)) {
      uVar1 = uVar1 << 8 | uVar1 >> 8;
    }
    local_40[0] = (uint)uVar1;
    MVar2 = 0;
  }
  if (result != (MemTxResult *)0x0) {
    *result = MVar2;
  }
  return local_40[0];
}

Assistant:

static inline uint32_t glue(address_space_lduw_internal, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, MemTxAttrs attrs, MemTxResult *result,
    enum device_endian endian)
{
    uint8_t *ptr;
    uint64_t val;
    MemoryRegion *mr;
    hwaddr l = 2;
    hwaddr addr1;
    MemTxResult r;
    bool release_lock = false;

    //RCU_READ_LOCK();
    mr = TRANSLATE(addr, &addr1, &l, false, attrs);
    if (l < 2 || !memory_access_is_direct(mr, false)) {
        release_lock |= prepare_mmio_access(mr);

        /* I/O case */
        r = memory_region_dispatch_read(uc, mr, addr1, &val,
                                        MO_16 | devend_memop(endian), attrs);
    } else {
        /* RAM case */
        ptr = qemu_map_ram_ptr(mr->uc, mr->ram_block, addr1);
        switch (endian) {
        case DEVICE_LITTLE_ENDIAN:
            val = lduw_le_p(ptr);
            break;
        case DEVICE_BIG_ENDIAN:
            val = lduw_be_p(ptr);
            break;
        default:
            val = lduw_p(ptr);
            break;
        }
        r = MEMTX_OK;
    }
    if (result) {
        *result = r;
    }
    //RCU_READ_UNLOCK();
    return val;
}